

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeStructCmpxchg<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  MemoryOrder MVar1;
  MemoryOrder *pMVar2;
  Err *pEVar3;
  bool bVar4;
  Err local_270;
  Err *local_250;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  undefined1 local_218 [8];
  Result<wasm::Ok> field;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> type;
  string local_170;
  Err local_150;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::MemoryOrder> _val_1;
  Result<wasm::MemoryOrder> order2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::MemoryOrder> _val;
  Result<wasm::MemoryOrder> order1;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
               super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
               super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20);
  memorder<wasm::WATParser::ParseDeclsCtx>
            ((Result<wasm::MemoryOrder> *)__return_storage_ptr___00,ctx);
  Result<wasm::MemoryOrder>::Result
            ((Result<wasm::MemoryOrder> *)local_78,
             (Result<wasm::MemoryOrder> *)__return_storage_ptr___00);
  local_90 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)local_78);
  bVar4 = local_90 == (Err *)0x0;
  if (!bVar4) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)local_78);
  if (bVar4) {
    memorder<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx);
    Result<wasm::MemoryOrder>::Result
              ((Result<wasm::MemoryOrder> *)&err_1,
               (Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
    local_110 = Result<wasm::MemoryOrder>::getErr((Result<wasm::MemoryOrder> *)&err_1);
    bVar4 = local_110 == (Err *)0x0;
    if (!bVar4) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::MemoryOrder>::~Result((Result<wasm::MemoryOrder> *)&err_1);
    if (bVar4) {
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      MVar1 = *pMVar2;
      pMVar2 = Result<wasm::MemoryOrder>::operator*
                         ((Result<wasm::MemoryOrder> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      if (MVar1 == *pMVar2) {
        typeidx<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_2,
                   (Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        pEVar3 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
        if (pEVar3 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar3);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&field.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
        if (pEVar3 == (Err *)0x0) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          fieldidx<wasm::WATParser::ParseDeclsCtx>(local_218,ctx);
          Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_3,(Result<wasm::Ok> *)local_218);
          local_250 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
          bVar4 = local_250 == (Err *)0x0;
          if (!bVar4) {
            wasm::Err::Err(&local_270,local_250);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_270);
            wasm::Err::~Err(&local_270);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
          if (bVar4) {
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_218);
            pMVar2 = Result<wasm::MemoryOrder>::operator*
                               ((Result<wasm::MemoryOrder> *)
                                ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20)
                               );
            NullInstrParserCtx::makeStructCmpxchg<wasm::Ok>
                      (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,*pMVar2);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_218);
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"struct.atomic.rmw memory orders must be identical",
                   (allocator<char> *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_150,&ctx->in,(ulong)pos,&local_170);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_150);
        wasm::Err::~Err(&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      }
    }
    Result<wasm::MemoryOrder>::~Result
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  }
  Result<wasm::MemoryOrder>::~Result
            ((Result<wasm::MemoryOrder> *)
             ((long)&_val.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructCmpxchg(Ctx& ctx,
                           Index pos,
                           const std::vector<Annotation>& annotations) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructCmpxchg(pos, annotations, *type, *field, *order1);
}